

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

string * __thiscall
QPDFJob::doUnderOverlayForPage_abi_cxx11_
          (string *__return_storage_ptr__,QPDFJob *this,QPDF *pdf,UnderOverlay *uo,
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *pagenos,size_t page_idx,size_t uo_idx,
          map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
          *fo,vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *pages,
          QPDFPageObjectHelper *dest_page)

{
  Rectangle rect;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *this_00;
  QPDFPageObjectHelper *pQVar1;
  UnderOverlay *foreign;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  QPDFAcroFormDocumentHelper *afdh_00;
  mapped_type *this_01;
  reference piVar6;
  size_t __n;
  reference pvVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  QPDFAcroFormDocumentHelper *from_afdh;
  ulong uVar11;
  allocator<char> local_2d1;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  QPDFObjectHandle xobject;
  QPDFPageObjectHelper local_290;
  undefined1 local_258 [24];
  element_type *peStack_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  element_type *peStack_230;
  QPDFObjectHandle local_228;
  undefined1 local_218 [8];
  string new_content;
  QPDFMatrix cm;
  string local_1c0;
  undefined1 local_1a0 [8];
  string name;
  int local_15c;
  value_type from_page;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  int local_ec;
  iterator iStack_e8;
  int from_pageno;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  string local_c8 [32];
  undefined1 local_a8 [8];
  QPDFObjectHandle resources;
  int min_suffix;
  QPDFAcroFormDocumentHelper *dest_afdh;
  anon_class_8_1_89895067 make_afdh;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh;
  allocator<char> local_3d;
  int local_3c;
  size_t sStack_38;
  int pageno;
  size_t page_idx_local;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  *pagenos_local;
  UnderOverlay *uo_local;
  QPDF *pdf_local;
  QPDFJob *this_local;
  string *content;
  
  sStack_38 = page_idx;
  page_idx_local = (size_t)pagenos;
  pagenos_local =
       (map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
        *)uo;
  uo_local = (UnderOverlay *)pdf;
  pdf_local = (QPDF *)this;
  this_local = (QPDFJob *)__return_storage_ptr__;
  local_3c = QIntC::to_int<unsigned_long>(&stack0xffffffffffffffc8);
  local_3c = local_3c + 1;
  sVar3 = std::
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          ::count((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                   *)page_idx_local,&local_3c);
  if (sVar3 != 0) {
    pmVar4 = std::
             map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
             ::operator[]((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                           *)page_idx_local,&local_3c);
    sVar5 = std::
            map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::count(pmVar4,&uo_idx);
    if (sVar5 != 0) {
      std::
      map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
      ::map((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
             *)&make_afdh);
      dest_afdh = (QPDFAcroFormDocumentHelper *)&make_afdh;
      afdh_00 = doUnderOverlayForPage::anon_class_8_1_89895067::operator()
                          ((anon_class_8_1_89895067 *)&dest_afdh,dest_page);
      resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      pQVar1 = dest_page;
      resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_c8,"/Resources",(allocator<char> *)((long)&__range1 + 7));
      QPDFPageObjectHelper::getAttribute
                ((QPDFPageObjectHelper *)local_a8,(string *)pQVar1,SUB81(local_c8,0));
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      pmVar4 = std::
               map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
               ::operator[]((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                             *)page_idx_local,&local_3c);
      this_01 = std::
                map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](pmVar4,&uo_idx);
      __end1 = std::vector<int,_std::allocator<int>_>::begin(this_01);
      iStack_e8 = std::vector<int,_std::allocator<int>_>::end(this_01);
      while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff18), bVar2) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end1);
        local_ec = *piVar6;
        from_page.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pagenos_local;
        std::function<void(Pipeline&,std::__cxx11::string_const&)>::
        function<QPDFJob::doUnderOverlayForPage(QPDF&,QPDFJob::UnderOverlay&,std::map<int,std::map<unsigned_long,std::vector<int,std::allocator<int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<int,std::allocator<int>>>>>,std::less<int>,std::allocator<std::pair<int_const,std::map<unsigned_long,std::vector<int,std::allocator<int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<int,std::allocator<int>>>>>>>>&,unsigned_long,unsigned_long,std::map<int,std::map<unsigned_long,QPDFObjectHandle,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFObjectHandle>>>,std::less<int>,std::allocator<std::pair<int_const,std::map<unsigned_long,QPDFObjectHandle,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFObjectHandle>>>>>>&,std::vector<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>&,QPDFPageObjectHelper&)::__0,void>
                  ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_110,
                   (anon_class_16_2_463c7cb6 *)
                   &from_page.m.
                    super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        doIfVerbose(this,&local_110);
        std::
        function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_110);
        this_00 = pages;
        local_15c = local_ec + -1;
        __n = QIntC::to_size<int>(&stack0xfffffffffffffea4);
        pvVar7 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                           (this_00,__n);
        QPDFPageObjectHelper::QPDFPageObjectHelper
                  ((QPDFPageObjectHelper *)&stack0xfffffffffffffea8,pvVar7);
        pmVar8 = std::
                 map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                 ::operator[](fo,&local_ec);
        sVar9 = std::
                map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                ::count(pmVar8,&uo_idx);
        foreign = uo_local;
        if (sVar9 == 0) {
          QPDFPageObjectHelper::getFormXObjectForPage
                    ((QPDFPageObjectHelper *)((long)&name.field_2 + 8),
                     SUB81(&stack0xfffffffffffffea8,0));
          QPDF::copyForeignObject((QPDF *)&stack0xfffffffffffffe90,(QPDFObjectHandle *)foreign);
          pmVar8 = std::
                   map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                   ::operator[](fo,&local_ec);
          pmVar10 = std::
                    map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                    ::operator[](pmVar8,&uo_idx);
          QPDFObjectHandle::operator=(pmVar10,(QPDFObjectHandle *)&stack0xfffffffffffffe90);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffe90);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&name.field_2 + 8));
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"/Fx",(allocator<char> *)((long)&cm.f + 7));
        QPDFObjectHandle::getUniqueResourceName
                  ((string *)local_1a0,(QPDFObjectHandle *)local_a8,&local_1c0,
                   (int *)&resources.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&cm.f + 7));
        QPDFMatrix::QPDFMatrix((QPDFMatrix *)((long)&new_content.field_2 + 8));
        pQVar1 = dest_page;
        pmVar8 = std::
                 map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                 ::operator[](fo,&local_ec);
        pmVar10 = std::
                  map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                  ::operator[](pmVar8,&uo_idx);
        QPDFObjectHandle::QPDFObjectHandle(&local_228,pmVar10);
        QPDFPageObjectHelper::getTrimBox((QPDFPageObjectHelper *)local_258,SUB81(dest_page,0),false)
        ;
        QPDFObjectHandle::getArrayAsRectangle
                  ((Rectangle *)(local_258 + 0x10),(QPDFObjectHandle *)local_258);
        rect.lly = (double)peStack_240;
        rect.llx = (double)local_258._16_8_;
        rect.urx = (double)local_238._M_pi;
        rect.ury = (double)peStack_230;
        QPDFPageObjectHelper::placeFormXObject
                  ((string *)local_218,pQVar1,&local_228,(string *)local_1a0,rect,
                   (QPDFMatrix *)((long)&new_content.field_2 + 8),true,true,false);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_258);
        QPDFObjectHandle::~QPDFObjectHandle(&local_228);
        pQVar1 = dest_page;
        QPDFPageObjectHelper::QPDFPageObjectHelper
                  (&local_290,(QPDFPageObjectHelper *)&stack0xfffffffffffffea8);
        from_afdh = doUnderOverlayForPage::anon_class_8_1_89895067::operator()
                              ((anon_class_8_1_89895067 *)&dest_afdh,
                               (QPDFPageObjectHelper *)&stack0xfffffffffffffea8);
        QPDFPageObjectHelper::copyAnnotations
                  (pQVar1,&local_290,(QPDFMatrix *)((long)&new_content.field_2 + 8),afdh_00,
                   from_afdh);
        QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_290);
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          operator____qpdf((char *)&xobject.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount,0x4234e6);
          QPDFObjectHandle::mergeResources
                    ((QPDFObjectHandle *)local_a8,
                     (QPDFObjectHandle *)
                     &xobject.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          QPDFObjectHandle::~QPDFObjectHandle
                    ((QPDFObjectHandle *)
                     &xobject.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_2d0,"/XObject",&local_2d1);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2b0,(string *)local_a8);
          std::__cxx11::string::~string(local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
          bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_2b0);
          if (bVar2) {
            pmVar8 = std::
                     map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
                     ::operator[](fo,&local_ec);
            pmVar10 = std::
                      map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>
                      ::operator[](pmVar8,&uo_idx);
            QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_2b0,(string *)local_1a0,pmVar10);
          }
          resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_ =
               (int)resources.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
          ;
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_218);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2b0);
        }
        std::__cxx11::string::~string((string *)local_218);
        std::__cxx11::string::~string((string *)local_1a0);
        QPDFPageObjectHelper::~QPDFPageObjectHelper
                  ((QPDFPageObjectHelper *)&stack0xfffffffffffffea8);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end1);
      }
      resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 1;
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a8);
      if ((resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._7_1_ & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      std::
      map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
      ::~map((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
              *)&make_afdh);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,anon_var_dwarf_49ee + 4,&local_3d);
  std::allocator<char>::~allocator(&local_3d);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::doUnderOverlayForPage(
    QPDF& pdf,
    UnderOverlay& uo,
    std::map<int, std::map<size_t, std::vector<int>>>& pagenos,
    size_t page_idx,
    size_t uo_idx,
    std::map<int, std::map<size_t, QPDFObjectHandle>>& fo,
    std::vector<QPDFPageObjectHelper>& pages,
    QPDFPageObjectHelper& dest_page)
{
    int pageno = 1 + QIntC::to_int(page_idx);
    if (!(pagenos.count(pageno) && pagenos[pageno].count(uo_idx))) {
        return "";
    }

    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh;
    auto make_afdh = [&](QPDFPageObjectHelper& ph) {
        QPDF& q = ph.getObjectHandle().getQPDF();
        return get_afdh_for_qpdf(afdh, &q);
    };
    auto dest_afdh = make_afdh(dest_page);

    std::string content;
    int min_suffix = 1;
    QPDFObjectHandle resources = dest_page.getAttribute("/Resources", true);
    for (int from_pageno: pagenos[pageno][uo_idx]) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << "    " << uo.filename << " " << uo.which << " " << from_pageno << "\n";
        });
        auto from_page = pages.at(QIntC::to_size(from_pageno - 1));
        if (fo[from_pageno].count(uo_idx) == 0) {
            fo[from_pageno][uo_idx] = pdf.copyForeignObject(from_page.getFormXObjectForPage());
        }

        // If the same page is overlaid or underlaid multiple times, we'll generate multiple names
        // for it, but that's harmless and also a pretty goofy case that's not worth coding around.
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);
        QPDFMatrix cm;
        std::string new_content = dest_page.placeFormXObject(
            fo[from_pageno][uo_idx], name, dest_page.getTrimBox().getArrayAsRectangle(), cm);
        dest_page.copyAnnotations(from_page, cm, dest_afdh, make_afdh(from_page));
        if (!new_content.empty()) {
            resources.mergeResources("<< /XObject << >> >>"_qpdf);
            auto xobject = resources.getKey("/XObject");
            if (xobject.isDictionary()) {
                xobject.replaceKey(name, fo[from_pageno][uo_idx]);
            }
            ++min_suffix;
            content += new_content;
        }
    }
    return content;
}